

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O0

void ritual_four(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  CHAR_DATA *pCVar2;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var3;
  MOB_INDEX_DATA *in_stack_00000020;
  bool in_stack_0000002f;
  CHAR_DATA *in_stack_00000030;
  AFFECT_DATA af;
  CHAR_DATA *mob;
  undefined1 in_stack_000012c2;
  undefined1 in_stack_000012c3;
  int in_stack_000012c4;
  int in_stack_000012c8;
  int in_stack_000012cc;
  CHAR_DATA *in_stack_000012d0;
  CHAR_DATA *in_stack_000012d8;
  int in_stack_000012f8;
  int in_stack_00001300;
  char *in_stack_00001308;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  ROOM_INDEX_DATA *in_stack_ffffffffffffff78;
  CHAR_DATA *in_stack_ffffffffffffff80;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  CHAR_DATA *in_stack_ffffffffffffffd0;
  
  if ((in_RDI->disrupted & 1U) == 0) {
    if (in_RDI->fighting == (CHAR_DATA *)0x0) {
      act(in_stack_ffffffffffffff60,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
          (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
          (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      act(in_stack_ffffffffffffff60,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
          (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
          (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      number_range(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      get_mob_index(in_stack_ffffffffffffff5c);
      pCVar2 = create_mobile(in_stack_00000020);
      char_to_room(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      pCVar2->hit = in_RSI->hit;
      pCVar2->max_hit = in_RSI->max_hit;
      pCVar2->level = in_RSI->level;
      bVar1 = is_affected(in_RSI,(int)gsn_unholy_bond);
      if (bVar1) {
        init_affect((AFFECT_DATA *)0x6c8fa3);
        affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
        ;
      }
      extract_char(in_stack_00000030,in_stack_0000002f);
      act(in_stack_ffffffffffffff60,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
          (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
          (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      add_follower(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      pCVar2->leader = in_RDI;
      _Var3 = std::pow<int,int>(0,0x6c904a);
      pCVar2->affected_by[0] = (long)_Var3 | pCVar2->affected_by[0];
      init_affect((AFFECT_DATA *)0x6c906f);
    }
    else {
      send_to_char(in_stack_ffffffffffffff60,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      act(in_stack_ffffffffffffff60,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
          (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
          (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      dice(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      damage_new(in_stack_000012d8,in_stack_000012d0,in_stack_000012cc,in_stack_000012c8,
                 in_stack_000012c4,(bool)in_stack_000012c3,(bool)in_stack_000012c2,in_stack_000012f8
                 ,in_stack_00001300,in_stack_00001308);
    }
  }
  return;
}

Assistant:

void ritual_four(CHAR_DATA *ch, CHAR_DATA *victim)
{

	CHAR_DATA *mob;
	AFFECT_DATA af;

	if (ch->disrupted)
		return;

	if (ch->fighting)
	{
		send_to_char("The Dark Gods are angered at the disruption, and unleash their fury upon you!\n\r", ch);
		act("A swirling black cloud coalesces above and lashes out at $n!", ch, nullptr, nullptr, TO_ROOM);
		damage_new(ch, ch, dice(18, 18), gsn_unholy_bond, DAM_NEGATIVE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "a nether bolt*");
		return;
	}

	act("$n points at $N and the rotting body crumbles to ashes!", ch, 0, victim, TO_ROOM);
	act("You point at $N and the rotting body crumbles to ashes!", ch, 0, victim, TO_CHAR);

	mob = create_mobile(get_mob_index(number_range(2940, 2942)));

	char_to_room(mob, ch->in_room);

	mob->hit = victim->hit;
	mob->max_hit = victim->max_hit;
	mob->level = victim->level;

	if (is_affected(victim, gsn_unholy_bond))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_unholy_bond;
		af.aftype = AFT_SKILL;
		af.duration = -1;
		affect_to_char(mob, &af);
	}

	extract_char(victim, true);

	act("From the ashes rises $n!", mob, 0, ch, TO_ALL);

	add_follower(mob, ch);

	mob->leader = ch;

	SET_BIT(mob->affected_by, AFF_CHARM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_unholy_bond;
	af.aftype = AFT_SKILL;
	af.duration = -1;
	//TODO: no affect_to_char or similar
}